

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void Frc_ManArrayShuffle(Vec_Int_t *vArray)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  
  if (0 < vArray->nSize) {
    lVar4 = 0;
    do {
      uVar3 = Gia_ManRandom(0);
      uVar3 = uVar3 % (uint)vArray->nSize;
      piVar2 = vArray->pArray;
      iVar1 = piVar2[lVar4];
      piVar2[lVar4] = piVar2[(int)uVar3];
      piVar2[(int)uVar3] = iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vArray->nSize);
  }
  return;
}

Assistant:

void Frc_ManArrayShuffle( Vec_Int_t * vArray )
{
    int i, iNext, Temp;
    for ( i = 0; i < vArray->nSize; i++ )
    {
        iNext = Gia_ManRandom( 0 ) % vArray->nSize;
        Temp = vArray->pArray[i];
        vArray->pArray[i] = vArray->pArray[iNext];
        vArray->pArray[iNext] = Temp;
    }
}